

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

BSDF * __thiscall
pbrt::CoatedConductorMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (void *param_1,long param_2,undefined1 (*param_3) [64],undefined8 *param_4,void *param_5)

{
  DielectricInterfaceBxDF DVar1;
  ConductorBxDF CVar2;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  TextureEvalContext ctx_04;
  TextureEvalContext ctx_05;
  TextureEvalContext ctx_06;
  TextureEvalContext ctx_07;
  TextureEvalContext ctx_08;
  SampledWavelengths lambda;
  SampledWavelengths lambda_00;
  SampledWavelengths lambda_01;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Float val;
  undefined1 auVar8 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  ulong uVar13;
  undefined1 auVar14 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  SampledSpectrum SVar15;
  Float gg;
  SampledSpectrum a;
  TrowbridgeReitzDistribution conductorDistrib;
  Float cvrough;
  Float curough;
  SampledSpectrum ck;
  SampledSpectrum ce;
  Float ieta;
  Float thick;
  TrowbridgeReitzDistribution interfaceDistrib;
  Float ivrough;
  Float iurough;
  undefined1 in_stack_fffffffffffffa68 [64];
  SampledSpectrum *pSVar16;
  undefined8 uVar17;
  Float eta;
  CoatedConductorBxDF *this;
  Vector3f *dpdus;
  Normal3f *in_stack_fffffffffffffac8;
  Normal3f *n;
  Vector3f *wo;
  BSDF *this_00;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  int high;
  UniversalTextureEvaluator *in_stack_fffffffffffffaf0;
  TrowbridgeReitzDistribution *mfDistrib;
  undefined8 in_stack_fffffffffffffaf8;
  undefined8 in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  undefined1 *puVar18;
  undefined8 in_stack_fffffffffffffb20;
  undefined1 *puVar19;
  undefined8 in_stack_fffffffffffffb28;
  undefined1 *puVar20;
  undefined8 in_stack_fffffffffffffb30;
  undefined1 *puVar21;
  SpectrumTextureHandle *in_stack_fffffffffffffb38;
  SpectrumTextureHandle *tex;
  UniversalTextureEvaluator *this_01;
  undefined4 in_stack_fffffffffffffb60;
  undefined2 in_stack_fffffffffffffb64;
  undefined1 in_stack_fffffffffffffb66;
  undefined1 in_stack_fffffffffffffb67;
  undefined8 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb74;
  undefined2 in_stack_fffffffffffffb7c;
  undefined1 in_stack_fffffffffffffb7e;
  undefined1 in_stack_fffffffffffffb7f;
  TrowbridgeReitzDistribution in_stack_fffffffffffffb80;
  BxDFHandle *in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbac;
  Float in_stack_fffffffffffffbb4;
  undefined8 in_stack_fffffffffffffbb8;
  undefined1 local_3b8 [16];
  SampledSpectrum *local_3a8;
  undefined8 uStack_3a0;
  CoatedConductorBxDF *pCStack_398;
  Vector3f *pVStack_390;
  undefined1 local_388 [64];
  undefined1 local_348 [16];
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  TrowbridgeReitzDistribution local_320;
  undefined1 local_318 [64];
  Float local_2cc;
  undefined1 local_2c8 [64];
  Float local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined1 local_258 [64];
  SpectrumTextureHandle local_210;
  SampledSpectrum local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [64];
  undefined1 local_190 [8];
  SampledSpectrum local_188;
  undefined1 local_178 [64];
  undefined1 local_138 [12];
  Float local_12c;
  undefined1 local_128 [64];
  undefined1 local_e8 [12];
  Float local_dc;
  TrowbridgeReitzDistribution local_d8;
  undefined1 local_d0 [64];
  Float local_84;
  undefined1 local_80 [64];
  Float local_34;
  void *local_30;
  undefined8 *local_28;
  undefined1 (*local_20) [64];
  long local_18;
  undefined1 local_9 [9];
  
  this_01 = (UniversalTextureEvaluator *)param_1;
  local_30 = param_5;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_9._1_8_ = param_1;
  FloatTextureHandle::FloatTextureHandle
            (in_stack_fffffffffffffa68._8_8_,in_stack_fffffffffffffa68._0_8_);
  memcpy(local_80,local_20,0x40);
  auVar3 = vmovdqu64_avx512f(local_80);
  auVar3 = vmovdqu64_avx512f(auVar3);
  ctx.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb08;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb00;
  ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffb00 >> 0x20)
  ;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffb10;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffb18;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffb20;
  ctx.uv.super_Tuple2<pbrt::Point2,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffb28;
  ctx.dudx = (Float)(int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  ctx.dudy = (Float)(int)in_stack_fffffffffffffb30;
  ctx.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  ctx._56_8_ = in_stack_fffffffffffffb38;
  local_34 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffffaf0,
                        (FloatTextureHandle *)
                        CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),ctx);
  FloatTextureHandle::FloatTextureHandle(auVar3._8_8_,auVar3._0_8_);
  memcpy(local_d0,local_20,0x40);
  auVar3 = vmovdqu64_avx512f(local_d0);
  auVar3 = vmovdqu64_avx512f(auVar3);
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb08;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb00;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffb10;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffb18;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffb20;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffb28;
  ctx_00.dudx = (Float)(int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  ctx_00.dudy = (Float)(int)in_stack_fffffffffffffb30;
  ctx_00.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  ctx_00._56_8_ = in_stack_fffffffffffffb38;
  local_84 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffffaf0,
                        (FloatTextureHandle *)
                        CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),ctx_00);
  if ((*(byte *)(param_2 + 0x58) & 1) != 0) {
    local_34 = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
    local_84 = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
  }
  TrowbridgeReitzDistribution::TrowbridgeReitzDistribution
            (auVar3._24_8_,auVar3._20_4_,auVar3._16_4_);
  puVar18 = local_e8;
  FloatTextureHandle::FloatTextureHandle(auVar3._8_8_,auVar3._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_128 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(local_128);
  auVar3 = vmovdqu64_avx512f(auVar3);
  puVar21 = local_9;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb08;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb00;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffb10;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar18;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffb20;
  ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffb28;
  ctx_01.dudx = (Float)(int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  ctx_01._48_8_ = puVar21;
  ctx_01._56_8_ = in_stack_fffffffffffffb38;
  local_dc = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffffaf0,
                        (FloatTextureHandle *)
                        CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),ctx_01);
  puVar19 = local_138;
  FloatTextureHandle::FloatTextureHandle(auVar3._8_8_,auVar3._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_178 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(local_178);
  auVar3 = vmovdqu64_avx512f(auVar3);
  uVar13 = 0;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb08;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb00;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffb10;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar18;
  ctx_02._32_8_ = puVar19;
  ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffb28;
  ctx_02.dudx = (Float)(int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  ctx_02._48_8_ = puVar21;
  ctx_02._56_8_ = in_stack_fffffffffffffb38;
  local_12c = UniversalTextureEvaluator::operator()
                        (in_stack_fffffffffffffaf0,
                         (FloatTextureHandle *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),ctx_02);
  puVar20 = local_190;
  SpectrumTextureHandle::SpectrumTextureHandle(auVar3._8_8_,auVar3._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_1d8 = vmovdqu64_avx512f(auVar3);
  local_1f8 = *local_28;
  uStack_1f0 = local_28[1];
  uStack_1e8 = local_28[2];
  uStack_1e0 = local_28[3];
  auVar4 = vmovdqu64_avx512f(local_1d8);
  auVar3 = vmovdqu64_avx512f(auVar4);
  auVar8 = ZEXT856(auVar4._8_8_);
  auVar14 = ZEXT856(uVar13);
  ctx_06.p.super_Tuple3<pbrt::Point3,_float>.y._0_2_ = in_stack_fffffffffffffb64;
  ctx_06.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffb60;
  ctx_06.p.super_Tuple3<pbrt::Point3,_float>.y._2_1_ = in_stack_fffffffffffffb66;
  ctx_06.p.super_Tuple3<pbrt::Point3,_float>.y._3_1_ = in_stack_fffffffffffffb67;
  ctx_06.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb68;
  ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffb70;
  ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffb74;
  ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb74 >> 0x20);
  ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._0_2_ = in_stack_fffffffffffffb7c;
  ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._2_1_ = in_stack_fffffffffffffb7e;
  ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._3_1_ = in_stack_fffffffffffffb7f;
  ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb80.alpha_x;
  ctx_06.uv.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffb80.alpha_y;
  ctx_06._40_8_ = in_stack_fffffffffffffb88;
  ctx_06.dudy = (float)in_stack_fffffffffffffb90;
  ctx_06.dvdx = SUB84(in_stack_fffffffffffffb90,4);
  ctx_06.dvdy = (float)in_stack_fffffffffffffb98;
  ctx_06.faceIndex = (int)SUB84(in_stack_fffffffffffffb98,4);
  lambda.lambda.values[2] = (float)in_stack_fffffffffffffba8;
  lambda.lambda.values[0] = (float)in_stack_fffffffffffffba0;
  lambda.lambda.values[1] = SUB84(in_stack_fffffffffffffba0,4);
  lambda.lambda.values[3] = (Float)in_stack_fffffffffffffbac;
  lambda.pdf.values[0] = SUB84(in_stack_fffffffffffffbac,4);
  lambda.pdf.values[1] = in_stack_fffffffffffffbb4;
  lambda.pdf.values[2] = (float)(int)in_stack_fffffffffffffbb8;
  lambda.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  SVar15 = UniversalTextureEvaluator::operator()(this_01,in_stack_fffffffffffffb38,ctx_06,lambda);
  auVar9._0_8_ = SVar15.values.values._8_8_;
  auVar9._8_56_ = auVar14;
  uVar13 = auVar14._8_8_;
  auVar4._0_8_ = SVar15.values.values._0_8_;
  auVar4._8_56_ = auVar8;
  local_188.values.values._0_8_ = vmovlpd_avx(auVar4._0_16_);
  local_188.values.values._8_8_ = vmovlpd_avx(auVar9._0_16_);
  tex = &local_210;
  SpectrumTextureHandle::SpectrumTextureHandle(auVar3._8_8_,auVar3._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_258 = vmovdqu64_avx512f(auVar3);
  local_278 = *local_28;
  uStack_270 = local_28[1];
  uStack_268 = local_28[2];
  uStack_260 = local_28[3];
  auVar4 = vmovdqu64_avx512f(local_258);
  auVar3 = vmovdqu64_avx512f(auVar4);
  auVar8 = ZEXT856(auVar4._8_8_);
  auVar14 = ZEXT856(uVar13);
  ctx_07.p.super_Tuple3<pbrt::Point3,_float>.y._0_2_ = in_stack_fffffffffffffb64;
  ctx_07.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffb60;
  ctx_07.p.super_Tuple3<pbrt::Point3,_float>.y._2_1_ = in_stack_fffffffffffffb66;
  ctx_07.p.super_Tuple3<pbrt::Point3,_float>.y._3_1_ = in_stack_fffffffffffffb67;
  ctx_07.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb68;
  ctx_07.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  ctx_07.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffb70;
  ctx_07.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffb74;
  ctx_07.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb74 >> 0x20);
  ctx_07.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._0_2_ = in_stack_fffffffffffffb7c;
  ctx_07.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._2_1_ = in_stack_fffffffffffffb7e;
  ctx_07.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._3_1_ = in_stack_fffffffffffffb7f;
  ctx_07.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb80.alpha_x;
  ctx_07.uv.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffb80.alpha_y;
  ctx_07._40_8_ = in_stack_fffffffffffffb88;
  ctx_07.dudy = (float)in_stack_fffffffffffffb90;
  ctx_07.dvdx = SUB84(in_stack_fffffffffffffb90,4);
  ctx_07.dvdy = (float)in_stack_fffffffffffffb98;
  ctx_07.faceIndex = (int)SUB84(in_stack_fffffffffffffb98,4);
  lambda_00.lambda.values[2] = (float)in_stack_fffffffffffffba8;
  lambda_00.lambda.values[0] = (float)in_stack_fffffffffffffba0;
  lambda_00.lambda.values[1] = SUB84(in_stack_fffffffffffffba0,4);
  lambda_00.lambda.values[3] = (Float)in_stack_fffffffffffffbac;
  lambda_00.pdf.values[0] = SUB84(in_stack_fffffffffffffbac,4);
  lambda_00.pdf.values[1] = in_stack_fffffffffffffbb4;
  lambda_00.pdf.values[2] = (float)(int)in_stack_fffffffffffffbb8;
  lambda_00.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  SVar15 = UniversalTextureEvaluator::operator()(this_01,tex,ctx_07,lambda_00);
  auVar10._0_8_ = SVar15.values.values._8_8_;
  auVar10._8_56_ = auVar14;
  auVar5._0_8_ = SVar15.values.values._0_8_;
  auVar5._8_56_ = auVar8;
  local_208.values.values._0_8_ = vmovlpd_avx(auVar5._0_16_);
  local_208.values.values._8_8_ = vmovlpd_avx(auVar10._0_16_);
  FloatTextureHandle::FloatTextureHandle(auVar3._8_8_,auVar3._0_8_);
  memcpy(local_2c8,local_20,0x40);
  auVar3 = vmovdqu64_avx512f(local_2c8);
  auVar3 = vmovdqu64_avx512f(auVar3);
  ctx_03.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb08;
  ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  ctx_03.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb00;
  ctx_03.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffb10;
  ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar18;
  ctx_03._32_8_ = puVar19;
  ctx_03._40_8_ = puVar20;
  ctx_03._48_8_ = puVar21;
  ctx_03._56_8_ = tex;
  local_27c = UniversalTextureEvaluator::operator()
                        (in_stack_fffffffffffffaf0,
                         (FloatTextureHandle *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),ctx_03);
  FloatTextureHandle::FloatTextureHandle(auVar3._8_8_,auVar3._0_8_);
  memcpy(local_318,local_20,0x40);
  auVar3 = vmovdqu64_avx512f(local_318);
  auVar3 = vmovdqu64_avx512f(auVar3);
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb08;
  ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb00;
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffb10;
  ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar18;
  ctx_04._32_8_ = puVar19;
  ctx_04._40_8_ = puVar20;
  ctx_04._48_8_ = puVar21;
  ctx_04._56_8_ = tex;
  local_2cc = UniversalTextureEvaluator::operator()
                        (in_stack_fffffffffffffaf0,
                         (FloatTextureHandle *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),ctx_04);
  if ((*(byte *)(param_2 + 0x58) & 1) != 0) {
    local_27c = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
    local_2cc = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
  }
  uVar13 = 0;
  mfDistrib = &local_320;
  TrowbridgeReitzDistribution::TrowbridgeReitzDistribution
            (auVar3._24_8_,auVar3._20_4_,auVar3._16_4_);
  n = (Normal3f *)local_348;
  SpectrumTextureHandle::SpectrumTextureHandle(auVar3._8_8_,auVar3._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_388 = vmovdqu64_avx512f(auVar3);
  pSVar16 = (SampledSpectrum *)*local_28;
  uVar17 = local_28[1];
  this = (CoatedConductorBxDF *)local_28[2];
  dpdus = (Vector3f *)local_28[3];
  auVar4 = vmovdqu64_avx512f(local_388);
  auVar3 = vmovdqu64_avx512f(auVar4);
  wo = (Vector3f *)local_9;
  auVar8 = ZEXT856(auVar4._8_8_);
  auVar14 = ZEXT856(uVar13);
  ctx_08.p.super_Tuple3<pbrt::Point3,_float>.y._0_2_ = in_stack_fffffffffffffb64;
  ctx_08.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffb60;
  ctx_08.p.super_Tuple3<pbrt::Point3,_float>.y._2_1_ = in_stack_fffffffffffffb66;
  ctx_08.p.super_Tuple3<pbrt::Point3,_float>.y._3_1_ = in_stack_fffffffffffffb67;
  ctx_08.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb68;
  ctx_08.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  ctx_08.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffb70;
  ctx_08.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffb74;
  ctx_08.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb74 >> 0x20);
  ctx_08.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._0_2_ = in_stack_fffffffffffffb7c;
  ctx_08.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._2_1_ = in_stack_fffffffffffffb7e;
  ctx_08.dpdy.super_Tuple3<pbrt::Vector3,_float>.y._3_1_ = in_stack_fffffffffffffb7f;
  ctx_08.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb80.alpha_x;
  ctx_08.uv.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffb80.alpha_y;
  ctx_08._40_8_ = in_stack_fffffffffffffb88;
  ctx_08.dudy = (float)in_stack_fffffffffffffb90;
  ctx_08.dvdx = SUB84(in_stack_fffffffffffffb90,4);
  ctx_08.dvdy = (float)in_stack_fffffffffffffb98;
  ctx_08.faceIndex = (int)SUB84(in_stack_fffffffffffffb98,4);
  lambda_01.lambda.values[2] = (float)in_stack_fffffffffffffba8;
  lambda_01.lambda.values[0] = (float)in_stack_fffffffffffffba0;
  lambda_01.lambda.values[1] = SUB84(in_stack_fffffffffffffba0,4);
  lambda_01.lambda.values[3] = (Float)in_stack_fffffffffffffbac;
  lambda_01.pdf.values[0] = SUB84(in_stack_fffffffffffffbac,4);
  lambda_01.pdf.values[1] = in_stack_fffffffffffffbb4;
  lambda_01.pdf.values[2] = (float)(int)in_stack_fffffffffffffbb8;
  lambda_01.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  local_3a8 = pSVar16;
  uStack_3a0 = uVar17;
  pCStack_398 = this;
  pVStack_390 = dpdus;
  SVar15 = UniversalTextureEvaluator::operator()(this_01,tex,ctx_08,lambda_01);
  eta = SUB84(uVar17,4);
  auVar11._0_8_ = SVar15.values.values._8_8_;
  auVar11._8_56_ = auVar14;
  auVar6._0_8_ = SVar15.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  local_348._8_8_ = vmovlpd_avx(auVar6._0_16_);
  local_338 = vmovlpd_avx(auVar11._0_16_);
  high = 1;
  SVar15 = Clamp<int,int>(auVar3._8_8_,auVar3._4_4_,auVar3._0_4_);
  auVar12._0_8_ = SVar15.values.values._8_8_;
  auVar12._8_56_ = auVar14;
  auVar7._0_8_ = SVar15.values.values._0_8_;
  auVar7._8_56_ = auVar8;
  local_330 = vmovlpd_avx(auVar7._0_16_);
  local_328 = vmovlpd_avx(auVar12._0_16_);
  this_00 = (BSDF *)local_3b8;
  FloatTextureHandle::FloatTextureHandle((FloatTextureHandle *)auVar3._8_8_,auVar3._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(auVar3);
  ctx_05.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffb08;
  ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  ctx_05.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb00;
  ctx_05.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffb10;
  ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar18;
  ctx_05._32_8_ = puVar19;
  ctx_05._40_8_ = puVar20;
  ctx_05._48_8_ = puVar21;
  ctx_05._56_8_ = tex;
  val = UniversalTextureEvaluator::operator()
                  ((UniversalTextureEvaluator *)mfDistrib,
                   (FloatTextureHandle *)CONCAT44(high,in_stack_fffffffffffffae8),ctx_05);
  local_3b8._12_4_ = Clamp<float,int,int>(val,-1,high);
  DielectricInterfaceBxDF::DielectricInterfaceBxDF
            ((DielectricInterfaceBxDF *)&stack0xfffffffffffffbac,local_12c,&local_d8);
  ConductorBxDF::ConductorBxDF
            ((ConductorBxDF *)&stack0xfffffffffffffb80,mfDistrib,&local_188,&local_208);
  DVar1.mfDistrib.alpha_y = SUB84(this_00,0);
  DVar1._0_8_ = wo;
  CVar2.eta.values.values[0] = (float)(int)in_stack_fffffffffffffaf8;
  CVar2.eta.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  CVar2.mfDistrib = (TrowbridgeReitzDistribution)mfDistrib;
  CVar2.eta.values.values[2] = (float)(int)in_stack_fffffffffffffb00;
  CVar2.eta.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  CVar2.k.values.values[0] = (float)(int)in_stack_fffffffffffffb08;
  CVar2.k.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  CVar2.k.values.values[2] = (float)(int)in_stack_fffffffffffffb10;
  CVar2.k.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  CoatedConductorBxDF::LayeredBxDF
            (this,DVar1,CVar2,eta,pSVar16,auVar3._60_4_,SUB83((ulong)dpdus >> 0x28,0));
  memcpy(local_30,&stack0xfffffffffffffbb8,0x4f);
  BxDFHandle::TaggedPointer<pbrt::CoatedConductorBxDF>
            (in_stack_fffffffffffffb88,(CoatedConductorBxDF *)in_stack_fffffffffffffb80);
  BSDF::BSDF(this_00,wo,n,in_stack_fffffffffffffac8,dpdus,(BxDFHandle *)this,eta);
  return (BSDF *)param_1;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda,
                              CoatedConductorBxDF *bxdf) const {
        Float iurough = texEval(interfaceURoughness, ctx);
        Float ivrough = texEval(interfaceVRoughness, ctx);
        if (remapRoughness) {
            iurough = TrowbridgeReitzDistribution::RoughnessToAlpha(iurough);
            ivrough = TrowbridgeReitzDistribution::RoughnessToAlpha(ivrough);
        }
        TrowbridgeReitzDistribution interfaceDistrib(iurough, ivrough);

        Float thick = texEval(thickness, ctx);
        Float ieta = texEval(interfaceEta, ctx);

        SampledSpectrum ce = texEval(conductorEta, ctx, lambda);
        SampledSpectrum ck = texEval(k, ctx, lambda);
        Float curough = texEval(conductorURoughness, ctx);
        Float cvrough = texEval(conductorVRoughness, ctx);
        if (remapRoughness) {
            curough = TrowbridgeReitzDistribution::RoughnessToAlpha(curough);
            cvrough = TrowbridgeReitzDistribution::RoughnessToAlpha(cvrough);
        }
        TrowbridgeReitzDistribution conductorDistrib(curough, cvrough);

        SampledSpectrum a = Clamp(texEval(albedo, ctx, lambda), 0, 1);
        Float gg = Clamp(texEval(g, ctx), -1, 1);

        *bxdf = CoatedConductorBxDF(DielectricInterfaceBxDF(ieta, interfaceDistrib),
                                    ConductorBxDF(conductorDistrib, ce, ck), thick, a, gg,
                                    config);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }